

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

utf8_size_t utf8_char_count(char *data,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  utf8_size_t uVar3;
  
  if (size == 0) {
    size = strlen(data);
  }
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if (size <= uVar2) {
      return uVar3;
    }
    sVar1 = utf8_char_length(data + uVar2);
    if (sVar1 == 0) break;
    uVar3 = uVar3 + 1;
    uVar2 = uVar2 + sVar1;
  }
  return uVar3;
}

Assistant:

utf8_size_t utf8_char_count(const char* data, size_t size)
{
    size_t i, bytes = 0;
    utf8_size_t count = 0;

    if (0 == size) {
        size = strlen(data);
    }

    for (i = 0; i < size; ++count, i += bytes) {
        if (0 == (bytes = utf8_char_length(&data[i]))) {
            break;
        }
    }

    return count;
}